

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O0

void __thiscall indk::Interlink::doInitOutput(Interlink *this)

{
  int iVar1;
  ostream *poVar2;
  Client *pCVar3;
  Client *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Interlink *local_10;
  Interlink *this_local;
  
  local_10 = this;
  iVar1 = System::getVerbosityLevel();
  if (0 < iVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Incoming Interlink connection from ");
    std::operator+(&local_50,&this->Host,":");
    std::operator+(&local_30,&local_50,&this->OutputPort);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pCVar3 = (Client *)operator_new(8);
  std::operator+(&local_a0,&this->Host,":");
  std::operator+(&local_80,&local_a0,&this->OutputPort);
  httplib::Client::Client(pCVar3,&local_80);
  this->Output = pCVar3;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pCVar3 = (Client *)this->Output;
  httplib::Client::set_read_timeout(pCVar3,5,0);
  httplib::Client::set_write_timeout(pCVar3,5,0);
  httplib::Client::set_connection_timeout(pCVar3,0,500000);
  std::atomic<bool>::store(&this->Interlinked,true,memory_order_seq_cst);
  return;
}

Assistant:

void indk::Interlink::doInitOutput() {
    if (indk::System::getVerbosityLevel() > 0)
        std::cout << "Incoming Interlink connection from " << Host+":"+OutputPort << std::endl;
    Output = new httplib::Client(Host+":"+OutputPort);
    auto output = (httplib::Client*)Output;
    output -> set_read_timeout(5, 0);
    output -> set_write_timeout(5, 0);
    output -> set_connection_timeout(0, 500000);
    Interlinked.store(true);
}